

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_cdef(lua_State *L)

{
  uint64_t uVar1;
  int errcode;
  CPState cp;
  CPState CStack_88;
  
  CStack_88.p = (char *)lj_lib_checkstr(L,1);
  CStack_88.cts = *(CTState **)((L->glref).ptr64 + 0x180);
  (CStack_88.cts)->L = L;
  CStack_88.p = (char *)((long)CStack_88.p + 0x18);
  CStack_88.param = L->base + 1;
  CStack_88.mode = 5;
  CStack_88.L = L;
  CStack_88.srcname = CStack_88.p;
  errcode = lj_cparse(&CStack_88);
  if (errcode == 0) {
    uVar1 = (L->glref).ptr64;
    if (*(ulong *)(uVar1 + 0x18) <= *(ulong *)(uVar1 + 0x10)) {
      lj_gc_step(L);
    }
    return 0;
  }
  lj_err_throw(L,errcode);
}

Assistant:

LJLIB_CF(ffi_cdef)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  CPState cp;
  int errcode;
  cp.L = L;
  cp.cts = ctype_cts(L);
  cp.srcname = strdata(s);
  cp.p = strdata(s);
  cp.param = L->base+1;
  cp.mode = CPARSE_MODE_MULTI|CPARSE_MODE_DIRECT;
  errcode = lj_cparse(&cp);
  if (errcode) lj_err_throw(L, errcode);  /* Propagate errors. */
  lj_gc_check(L);
  return 0;
}